

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall EnvironmentNAVXYTHETALAT::InitializeEnvironment(EnvironmentNAVXYTHETALAT *this)

{
  pointer ppEVar1;
  int iVar2;
  ulong uVar3;
  EnvNAVXYTHETALATHashEntry_t **ppEVar4;
  undefined8 *puVar5;
  long lVar6;
  int *piVar7;
  code *pcVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar3 = (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.NumThetaDirs *
          (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvHeight_c *
          (long)(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EnvWidth_c;
  iVar2 = (int)uVar3;
  if (iVar2 < 0x5f5e101) {
    uVar12 = 0;
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar10 = uVar3 * 8;
    }
    uVar13 = 0;
    if (0 < iVar2) {
      uVar13 = uVar3 & 0xffffffff;
    }
    ppEVar4 = (EnvNAVXYTHETALATHashEntry_t **)operator_new__(uVar10);
    this->Coord2StateIDHashTable_lookup = ppEVar4;
    for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
      this->Coord2StateIDHashTable_lookup[uVar12] = (EnvNAVXYTHETALATHashEntry_t *)0x0;
    }
    this->GetHashEntry = 0x2e1;
    *(undefined8 *)&this->field_0x1c8 = 0;
    this->CreateNewHashEntry = 0x2e9;
    *(undefined8 *)&this->field_0x1d8 = 0;
    this->HashTableSize = 0;
    lVar6 = 0x2e1;
    lVar9 = 0x198;
  }
  else {
    this->HashTableSize = 0x400000;
    puVar5 = (undefined8 *)operator_new__(0x6000008);
    *puVar5 = 0x400000;
    memset((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
           (puVar5 + 1),0,0x6000000);
    this->Coord2StateIDHashTable =
         (vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_> *)
         (puVar5 + 1);
    this->GetHashEntry = 0x2d1;
    *(undefined8 *)&this->field_0x1c8 = 0;
    this->CreateNewHashEntry = 0x2d9;
    *(undefined8 *)&this->field_0x1d8 = 0;
    lVar6 = 0x2d1;
    lVar9 = 0x1b8;
  }
  *(undefined8 *)
   ((long)&(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
           _vptr_DiscreteSpaceInformation + lVar9) = 0;
  ppEVar1 = (this->StateID2CoordTable).
            super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->StateID2CoordTable).
      super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar1) {
    (this->StateID2CoordTable).
    super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppEVar1;
  }
  piVar7 = (int *)(**(code **)((long)(this->super_EnvironmentNAVXYTHETALATTICE).
                                     super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                              lVar6 + -1))
                            (this,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                  StartX_c,
                             (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.StartY_c
                             ,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              StartTheta);
  if (piVar7 == (int *)0x0) {
    pcVar8 = (code *)this->CreateNewHashEntry;
    plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                              super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                      *(long *)&this->field_0x1d8);
    if (((ulong)pcVar8 & 1) != 0) {
      pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
    }
    piVar7 = (int *)(*pcVar8)(plVar11,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg
                                      .StartX_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              StartY_c,(this->super_EnvironmentNAVXYTHETALATTICE).
                                       EnvNAVXYTHETALATCfg.StartTheta);
  }
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.startstateid = *piVar7;
  pcVar8 = (code *)this->GetHashEntry;
  plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                            super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                    *(long *)&this->field_0x1c8);
  if (((ulong)pcVar8 & 1) != 0) {
    pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
  }
  piVar7 = (int *)(*pcVar8)(plVar11,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                                    EndX_c,
                            (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c,
                            (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndTheta)
  ;
  if (piVar7 == (int *)0x0) {
    pcVar8 = (code *)this->CreateNewHashEntry;
    plVar11 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                              super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                      *(long *)&this->field_0x1d8);
    if (((ulong)pcVar8 & 1) != 0) {
      pcVar8 = *(code **)(pcVar8 + *plVar11 + -1);
    }
    piVar7 = (int *)(*pcVar8)(plVar11,(this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg
                                      .EndX_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.EndY_c,
                              (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.
                              EndTheta);
  }
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.goalstateid = *piVar7;
  (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALAT.bInitialized = true;
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::InitializeEnvironment()
{
    EnvNAVXYTHETALATHashEntry_t* HashEntry;

    int maxsize = EnvNAVXYTHETALATCfg.EnvWidth_c * EnvNAVXYTHETALATCfg.EnvHeight_c * EnvNAVXYTHETALATCfg.NumThetaDirs;

    if (maxsize <= SBPL_XYTHETALAT_MAXSTATESFORLOOKUP) {
        SBPL_PRINTF("environment stores states in lookup table\n");

        Coord2StateIDHashTable_lookup = new EnvNAVXYTHETALATHashEntry_t*[maxsize];
        for (int i = 0; i < maxsize; i++) {
            Coord2StateIDHashTable_lookup[i] = NULL;
        }
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_lookup;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup;

        // not using hash table
        HashTableSize = 0;
        Coord2StateIDHashTable = NULL;
    }
    else {
        SBPL_PRINTF("environment stores states in hashtable\n");

        // initialize the map from Coord to StateID
        HashTableSize = 4 * 1024 * 1024; // should be power of two
        Coord2StateIDHashTable = new std::vector<EnvNAVXYTHETALATHashEntry_t*>[HashTableSize];
        GetHashEntry = &EnvironmentNAVXYTHETALAT::GetHashEntry_hash;
        CreateNewHashEntry = &EnvironmentNAVXYTHETALAT::CreateNewHashEntry_hash;

        // not using hash
        Coord2StateIDHashTable_lookup = NULL;
    }

    // initialize the map from StateID to Coord
    StateID2CoordTable.clear();

    // create start state
    if (NULL == (HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.StartX_c,
            EnvNAVXYTHETALATCfg.StartY_c,
            EnvNAVXYTHETALATCfg.StartTheta)))
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.StartX_c,
                EnvNAVXYTHETALATCfg.StartY_c,
                EnvNAVXYTHETALATCfg.StartTheta);
    }
    EnvNAVXYTHETALAT.startstateid = HashEntry->stateID;

    // create goal state
    if ((HashEntry = (this->*GetHashEntry)(
            EnvNAVXYTHETALATCfg.EndX_c,
            EnvNAVXYTHETALATCfg.EndY_c,
            EnvNAVXYTHETALATCfg.EndTheta)) == NULL)
    {
        // have to create a new entry
        HashEntry = (this->*CreateNewHashEntry)(
                EnvNAVXYTHETALATCfg.EndX_c,
                EnvNAVXYTHETALATCfg.EndY_c,
                EnvNAVXYTHETALATCfg.EndTheta);
    }
    EnvNAVXYTHETALAT.goalstateid = HashEntry->stateID;

    // initialized
    EnvNAVXYTHETALAT.bInitialized = true;
}